

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_iov.c
# Opt level: O0

int mk_iov_set_entry(mk_iov *mk_io,void *buf,int len,int free,int idx)

{
  int idx_local;
  int free_local;
  int len_local;
  void *buf_local;
  mk_iov *mk_io_local;
  
  mk_io->io[idx].iov_base = buf;
  mk_io->io[idx].iov_len = (long)len;
  mk_io->total_len = (long)len + mk_io->total_len;
  if (free == 1) {
    _mk_iov_set_free(mk_io,buf);
  }
  return 0;
}

Assistant:

int mk_iov_set_entry(struct mk_iov *mk_io, void *buf, int len,
                     int free, int idx)
{
    mk_io->io[idx].iov_base = buf;
    mk_io->io[idx].iov_len = len;
    mk_io->total_len += len;

    if (free == MK_TRUE) {
        _mk_iov_set_free(mk_io, buf);
    }

    return 0;
}